

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_int_t ngx_http_variable_remote_port
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  in_port_t iVar1;
  u_char *puVar2;
  ngx_int_t nVar3;
  
  *(uint *)v = *(uint *)v & 0x80000000 | 0x10000000;
  puVar2 = (u_char *)ngx_pnalloc(r->pool,5);
  v->data = puVar2;
  if (puVar2 == (u_char *)0x0) {
    nVar3 = -1;
  }
  else {
    iVar1 = ngx_inet_get_port(r->connection->sockaddr);
    if (iVar1 == 0) {
      nVar3 = 0;
    }
    else {
      nVar3 = 0;
      puVar2 = ngx_sprintf(v->data,"%ui",(ulong)iVar1);
      *(uint *)v = *(uint *)v & 0xf0000000 | (int)puVar2 - *(int *)&v->data & 0xfffffffU;
    }
  }
  return nVar3;
}

Assistant:

static ngx_int_t
ngx_http_variable_remote_port(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_uint_t  port;

    v->len = 0;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    v->data = ngx_pnalloc(r->pool, sizeof("65535") - 1);
    if (v->data == NULL) {
        return NGX_ERROR;
    }

    port = ngx_inet_get_port(r->connection->sockaddr);

    if (port > 0 && port < 65536) {
        v->len = ngx_sprintf(v->data, "%ui", port) - v->data;
    }

    return NGX_OK;
}